

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O2

string * __thiscall
cxxopts::values::abstract_value<unsigned_int>::get_default_value_abi_cxx11_
          (string *__return_storage_ptr__,abstract_value<unsigned_int> *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->m_default_value);
  return __return_storage_ptr__;
}

Assistant:

std::string
  get_default_value() const override
  {
    return m_default_value;
  }